

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

char * Bbl_ManTruthToSop(uint *pTruth,int nVars)

{
  undefined1 uVar1;
  int iVar2;
  undefined1 *puVar3;
  int local_40;
  int local_3c;
  int v;
  int b;
  int nOnes;
  int nMints;
  char *pTemp;
  char *pResult;
  int nVars_local;
  uint *pTruth_local;
  
  if ((nVars < 0) || (0x10 < nVars)) {
    __assert_fail("nVars >= 0 && nVars <= 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                  ,0x4fd,"char *Bbl_ManTruthToSop(unsigned int *, int)");
  }
  iVar2 = 1 << ((byte)nVars & 0x1f);
  v = 0;
  for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
    v = (pTruth[local_3c >> 5] >> ((byte)local_3c & 0x1f) & 1) + v;
  }
  if ((v == 0) || (v == iVar2)) {
    pTruth_local = (uint *)malloc((long)(nVars + 4));
    _nOnes = pTruth_local;
    for (local_40 = 0; local_40 < nVars; local_40 = local_40 + 1) {
      *(undefined1 *)_nOnes = 0x2d;
      _nOnes = (uint *)((long)_nOnes + 1);
    }
    *(undefined1 *)_nOnes = 0x20;
    uVar1 = 0x30;
    if (v != 0) {
      uVar1 = 0x31;
    }
    *(undefined1 *)((long)_nOnes + 1) = uVar1;
    *(undefined1 *)((long)_nOnes + 2) = 10;
    *(undefined1 *)((long)_nOnes + 3) = 0;
    if ((undefined1 *)((long)_nOnes + (4 - (long)pTruth_local)) != (undefined1 *)(long)(nVars + 4))
    {
      __assert_fail("pTemp - pResult == nVars + 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                    ,0x50d,"char *Bbl_ManTruthToSop(unsigned int *, int)");
    }
  }
  else {
    pTruth_local = (uint *)malloc((long)(v * (nVars + 3) + 1));
    _nOnes = pTruth_local;
    for (local_3c = 0; local_3c < iVar2; local_3c = local_3c + 1) {
      if ((pTruth[local_3c >> 5] >> ((byte)local_3c & 0x1f) & 1) != 0) {
        for (local_40 = 0; local_40 < nVars; local_40 = local_40 + 1) {
          uVar1 = 0x30;
          if ((local_3c >> ((byte)local_40 & 0x1f) & 1U) != 0) {
            uVar1 = 0x31;
          }
          *(undefined1 *)_nOnes = uVar1;
          _nOnes = (uint *)((long)_nOnes + 1);
        }
        *(undefined1 *)_nOnes = 0x20;
        puVar3 = (undefined1 *)((long)_nOnes + 2);
        *(undefined1 *)((long)_nOnes + 1) = 0x31;
        _nOnes = (uint *)((long)_nOnes + 3);
        *puVar3 = 10;
      }
    }
    *(undefined1 *)_nOnes = 0;
    if ((undefined1 *)((long)_nOnes + (1 - (long)pTruth_local)) !=
        (undefined1 *)(long)(v * (nVars + 3) + 1)) {
      __assert_fail("pTemp - pResult == nOnes * (nVars + 3) + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/bbl/bblif.c"
                    ,0x51c,"char *Bbl_ManTruthToSop(unsigned int *, int)");
    }
  }
  return (char *)pTruth_local;
}

Assistant:

char * Bbl_ManTruthToSop( unsigned * pTruth, int nVars )
{
    char * pResult, * pTemp;
    int nMints, nOnes, b, v;
    assert( nVars >= 0 && nVars <= 16 );
    nMints = (1 << nVars);
    // count the number of ones
    nOnes = 0;
    for ( b = 0; b < nMints; b++ )
        nOnes += ((pTruth[b>>5] >> (b&31)) & 1);
    // handle constants
    if ( nOnes == 0 || nOnes == nMints )
    {
        pResult = pTemp = BBLIF_ALLOC( char, nVars + 4 );        
        for ( v = 0; v < nVars; v++ )
            *pTemp++ = '-';
        *pTemp++ = ' ';
        *pTemp++ = nOnes? '1' : '0';
        *pTemp++ = '\n';
        *pTemp++ = 0;
        assert( pTemp - pResult == nVars + 4 );
        return pResult;
    }
    pResult = pTemp = BBLIF_ALLOC( char, nOnes * (nVars + 3) + 1 );        
    for ( b = 0; b < nMints; b++ )
    {
        if ( ((pTruth[b>>5] >> (b&31)) & 1) == 0 )
            continue;
        for ( v = 0; v < nVars; v++ )
            *pTemp++ = ((b >> v) & 1)? '1' : '0';
        *pTemp++ = ' ';
        *pTemp++ = '1';
        *pTemp++ = '\n';
    }
    *pTemp++ = 0;
    assert( pTemp - pResult == nOnes * (nVars + 3) + 1 );
    return pResult;
}